

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::SubjectFactory::FX::FXBase::SetFixingDate
          (FXBase *this,string *fixing_key,Date *date)

{
  FX *pFVar1;
  string sStack_38;
  
  pFVar1 = this->outer_class_;
  tools::Date::ToString_abi_cxx11_(&sStack_38,date);
  SubjectBuilder::SetComponent
            (&(pFVar1->super_MandatoryFieldsSubjectCreator).subject_builder_,fixing_key,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void SubjectFactory::FX::FXBase::SetFixingDate(const std::string& fixing_key, Date* date)
{
    outer_class_.subject_builder_.SetComponent(fixing_key, date->ToString());
}